

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

string_t duckdb::TernaryLambdaWrapper::
         Operation<duckdb::SetBitOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,int,int,duckdb::string_t>
                   (anon_class_8_1_6971b95b fun,string_t a,int b,int c,ValidityMask *mask,idx_t idx)

{
  idx_t iVar1;
  OutOfRangeException *this;
  InvalidInputException *this_00;
  undefined8 extraout_RDX;
  Bit *this_01;
  char *__dest;
  void *__src;
  bitstring_t bits;
  bitstring_t bits_00;
  allocator local_a1;
  string_t target;
  undefined8 local_80;
  void *local_78;
  string local_70;
  string local_50;
  idx_t len;
  
  bits.value._8_8_ = a.value._8_8_;
  this_01 = a.value._0_8_;
  local_80 = this_01;
  local_78 = bits.value._8_8_;
  if (1 < (uint)c) {
    this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&target,"The new bit must be 1 or 0",(allocator *)&local_70);
    InvalidInputException::InvalidInputException(this_00,(string *)&target);
    __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (-1 < b) {
    bits.value._0_8_ = bits.value._8_8_;
    iVar1 = Bit::BitLength(this_01,bits);
    if ((ulong)(uint)b <= iVar1 - 1) {
      target = StringVector::EmptyString
                         ((StringVector *)fun.result,(Vector *)((ulong)this_01 & 0xffffffff),len);
      __dest = (char *)((long)&target.value + 4);
      if (0xc < target.value._0_4_) {
        __dest = target.value._8_8_;
      }
      __src = bits.value._8_8_;
      if (a.value._0_4_ < 0xd) {
        __src = (void *)((long)&local_80 + 4);
      }
      switchD_01939fa4::default(__dest,__src,(size_t)((ulong)this_01 & 0xffffffff));
      Bit::SetBit(&target,(ulong)(uint)b,(ulong)(uint)c);
      return (string_t)target.value;
    }
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&target,"bit index %s out of valid range (0..%s)",&local_a1);
  ::std::__cxx11::to_string(&local_70,b);
  bits_00.value.pointer.ptr = (char *)extraout_RDX;
  bits_00.value._0_8_ = bits.value._8_8_;
  iVar1 = Bit::BitLength(this_01,bits_00);
  ::std::__cxx11::to_string(&local_50,iVar1 - 1);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
            (this,(string *)&target,&local_70,&local_50);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline RESULT_TYPE Operation(FUN fun, A_TYPE a, B_TYPE b, C_TYPE c, ValidityMask &mask, idx_t idx) {
		return fun(a, b, c);
	}